

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O2

void __thiscall
vkt::Draw::RenderPassCreateInfo::addAttachment
          (RenderPassCreateInfo *this,VkAttachmentDescription attachment)

{
  pointer pVVar1;
  allocator_type local_41;
  AttachmentDescription local_40;
  
  AttachmentDescription::AttachmentDescription(&local_40,&attachment);
  std::vector<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>::
  emplace_back<vkt::Draw::AttachmentDescription>(&this->m_attachments,&local_40);
  std::vector<vk::VkAttachmentDescription,std::allocator<vk::VkAttachmentDescription>>::
  vector<__gnu_cxx::__normal_iterator<vkt::Draw::AttachmentDescription*,std::vector<vkt::Draw::AttachmentDescription,std::allocator<vkt::Draw::AttachmentDescription>>>,void>
            ((vector<vk::VkAttachmentDescription,std::allocator<vk::VkAttachmentDescription>> *)
             &local_40,
             (this->m_attachments).
             super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_attachments).
             super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
             ._M_impl.super__Vector_impl_data._M_finish,&local_41);
  std::vector<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::
  _M_move_assign(&this->m_attachmentsStructs,
                 (vector<vk::VkAttachmentDescription,std::allocator<vk::VkAttachmentDescription>> *)
                 &local_40);
  std::_Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>::
  ~_Vector_base((_Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
                 *)&local_40);
  pVVar1 = (this->m_attachmentsStructs).
           super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (this->super_VkRenderPassCreateInfo).attachmentCount =
       (deUint32)
       (((long)(this->m_attachments).
               super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->m_attachments).
              super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x24);
  (this->super_VkRenderPassCreateInfo).pAttachments = pVVar1;
  return;
}

Assistant:

void
RenderPassCreateInfo::addAttachment (vk::VkAttachmentDescription attachment)
{

	m_attachments.push_back(attachment);
	m_attachmentsStructs	= std::vector<vk::VkAttachmentDescription>(m_attachments.begin(), m_attachments.end());
	attachmentCount			= static_cast<deUint32>(m_attachments.size());
	pAttachments			= &m_attachmentsStructs[0];
}